

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

void Abc_NtkCecFraigPartAuto(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pMiter;
  int *piVar2;
  Abc_Frame_t *pAVar3;
  Vec_Ptr_t *p;
  Vec_Ptr_t *vOutsPtr;
  void **ppvVar4;
  Vec_Int_t *vOuts;
  int iVar5;
  char *pcVar6;
  int i;
  long lVar7;
  uint i_00;
  Abc_Ntk_t *pMiterPart;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  Abc_Ntk_t *local_90;
  Prove_Params_t Params;
  
  Prove_ParamsSetDefault(&Params);
  Params.nItersMax = 5;
  iVar5 = 1;
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,1,1,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    puts("Miter computation has failed.");
    return;
  }
  iVar1 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar1 == 1) {
    pcVar6 = "Networks are equivalent after structural hashing.";
  }
  else {
    if (iVar1 == 0) {
      puts("Networks are NOT EQUIVALENT after structural hashing.");
      piVar2 = Abc_NtkVerifyGetCleanModel(pMiter,1);
      pMiter->pModel = piVar2;
      Abc_NtkVerifyReportError(pNtk1,pNtk2,piVar2);
      if (pMiter->pModel != (int *)0x0) {
        free(pMiter->pModel);
        pMiter->pModel = (int *)0x0;
      }
      goto LAB_00283a63;
    }
    local_90 = pNtk1;
    pAVar3 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar3,"unset progressbar");
    p = Abc_NtkPartitionSmart(pMiter,300,0);
    vOutsPtr = (Vec_Ptr_t *)malloc(0x10);
    vOutsPtr->nCap = 1000;
    vOutsPtr->nSize = 0;
    ppvVar4 = (void **)malloc(8000);
    vOutsPtr->pArray = ppvVar4;
    i_00 = 0;
    local_a4 = 0;
    while ((int)i_00 < p->nSize) {
      vOuts = (Vec_Int_t *)Vec_PtrEntry(p,i_00);
      Abc_NtkConvertCos(pMiter,vOuts,vOutsPtr);
      pMiterPart = Abc_NtkCreateConeArray(pMiter,vOutsPtr,0);
      Abc_NtkCombinePos(pMiterPart,0,0);
      iVar1 = Abc_NtkMiterIsConstant(pMiterPart);
      if (iVar1 == 1) {
        Abc_NtkDelete(pMiterPart);
        i_00 = i_00 + 1;
      }
      else {
        if (iVar1 == 0) {
          puts("Networks are NOT EQUIVALENT after partitioning.");
LAB_002839ea:
          Abc_NtkDelete(pMiterPart);
          break;
        }
        i_00 = i_00 + 1;
        local_94 = p->nSize;
        local_98 = pMiterPart->vPis->nSize;
        local_9c = pMiterPart->vPos->nSize;
        local_a0 = pMiterPart->nObjCounts[7];
        iVar1 = Abc_AigLevel(pMiterPart);
        printf("Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
               (ulong)i_00,(ulong)local_94,(ulong)local_98,(ulong)local_9c,(ulong)local_a0,iVar1);
        fflush(_stdout);
        iVar1 = Abc_NtkIvyProve(&pMiterPart,&Params);
        if (iVar1 == -1) {
          printf("Networks are undecided (resource limits is reached).\r");
          iVar5 = -1;
        }
        else {
          if (iVar1 == 0) {
            piVar2 = Abc_NtkVerifySimulatePattern(pMiterPart,pMiterPart->pModel);
            pcVar6 = "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.";
            if (*piVar2 == 1) {
              pcVar6 = "Networks are NOT EQUIVALENT.                 ";
            }
            puts(pcVar6);
            free(piVar2);
            iVar5 = 0;
            goto LAB_002839ea;
          }
          local_a4 = local_a4 + vOuts->nSize;
        }
        Abc_NtkDelete(pMiterPart);
      }
    }
    printf(
          "                                                                                          \r"
          );
    for (lVar7 = 0; lVar7 < p->nSize; lVar7 = lVar7 + 1) {
      if ((Vec_Ptr_t *)p->pArray[lVar7] != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree((Vec_Ptr_t *)p->pArray[lVar7]);
      }
    }
    Vec_PtrFree(p);
    Vec_PtrFree(vOutsPtr);
    pAVar3 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar3,"set progressbar");
    if (iVar5 == -1) {
      printf("Timed out after verifying %d outputs (out of %d).\n",(ulong)local_a4,
             (ulong)(uint)local_90->vCos->nSize);
      goto LAB_00283a63;
    }
    if (iVar5 != 1) goto LAB_00283a63;
    pcVar6 = "Networks are equivalent.                         ";
  }
  puts(pcVar6);
LAB_00283a63:
  Abc_NtkDelete(pMiter);
  return;
}

Assistant:

void Abc_NtkCecFraigPartAuto( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose )
{
    extern Vec_Ptr_t * Abc_NtkPartitionSmart( Abc_Ntk_t * pNtk, int nPartSizeLimit, int fVerbose );
    extern void Abc_NtkConvertCos( Abc_Ntk_t * pNtk, Vec_Int_t * vOuts, Vec_Ptr_t * vOnePtr );

    Vec_Ptr_t * vParts, * vOnePtr;
    Vec_Int_t * vOne;
    Prove_Params_t Params, * pParams = &Params;
    Abc_Ntk_t * pMiter, * pMiterPart;
    int i, RetValue, Status, nOutputs;

    // solve the CNF using the SAT solver
    Prove_ParamsSetDefault( pParams );
    pParams->nItersMax = 5;
    //    pParams->fVerbose = 1;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 1, 1, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, 1 );
        Abc_NtkVerifyReportError( pNtk1, pNtk2, pMiter->pModel );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return;
    }
    if ( RetValue == 1 )
    {
        printf( "Networks are equivalent after structural hashing.\n" );
        Abc_NtkDelete( pMiter );
        return;
    }

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // partition the outputs
    vParts = Abc_NtkPartitionSmart( pMiter, 300, 0 );

    // fraig each partition
    Status = 1;
    nOutputs = 0;
    vOnePtr = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        // get this part of the miter
        Abc_NtkConvertCos( pMiter, vOne, vOnePtr );
        pMiterPart = Abc_NtkCreateConeArray( pMiter, vOnePtr, 0 );
        Abc_NtkCombinePos( pMiterPart, 0, 0 );
        // check the miter for being constant
        RetValue = Abc_NtkMiterIsConstant( pMiterPart );
        if ( RetValue == 0 )
        {
            printf( "Networks are NOT EQUIVALENT after partitioning.\n" );
            Abc_NtkDelete( pMiterPart );
            break;
        }
        if ( RetValue == 1 )
        {
            Abc_NtkDelete( pMiterPart );
            continue;
        }
        printf( "Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
            i+1, Vec_PtrSize(vParts), Abc_NtkPiNum(pMiterPart), Abc_NtkPoNum(pMiterPart), 
            Abc_NtkNodeNum(pMiterPart), Abc_AigLevel(pMiterPart) );
        fflush( stdout );
        // solve the problem
        RetValue = Abc_NtkIvyProve( &pMiterPart, pParams );
        if ( RetValue == -1 )
        {
            printf( "Networks are undecided (resource limits is reached).\r" );
            Status = -1;
        }
        else if ( RetValue == 0 )
        {
            int * pSimInfo = Abc_NtkVerifySimulatePattern( pMiterPart, pMiterPart->pModel );
            if ( pSimInfo[0] != 1 )
                printf( "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
            else
                printf( "Networks are NOT EQUIVALENT.                 \n" );
            ABC_FREE( pSimInfo );
            Status = 0;
            Abc_NtkDelete( pMiterPart );
            break;
        }
        else
        {
//            printf( "Finished part %5d (out of %5d)\r", i+1, Vec_PtrSize(vParts) );
            nOutputs += Vec_IntSize(vOne);
        }
        Abc_NtkDelete( pMiterPart );
    }
    printf( "                                                                                          \r" );
    Vec_VecFree( (Vec_Vec_t *)vParts );
    Vec_PtrFree( vOnePtr );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    if ( Status == 1 )
        printf( "Networks are equivalent.                         \n" );
    else if ( Status == -1 )
        printf( "Timed out after verifying %d outputs (out of %d).\n", nOutputs, Abc_NtkCoNum(pNtk1) );
    Abc_NtkDelete( pMiter );
}